

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::reserve
          (vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_> *this,
          size_t n)

{
  LightHandle *p;
  ulong uVar1;
  LightHandle *pLVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    pLVar2 = pmr::polymorphic_allocator<pbrt::LightHandle>::allocate_object<pbrt::LightHandle>
                       (&this->alloc,n);
    p = this->ptr;
    uVar1 = this->nStored;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      pLVar2[uVar3].
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = 0;
      pLVar2[uVar3].
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = p[uVar3].
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              .bits;
    }
    pmr::polymorphic_allocator<pbrt::LightHandle>::deallocate_object<pbrt::LightHandle>
              (&this->alloc,p,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pLVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }